

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_test.cpp
# Opt level: O0

void __thiscall Boolean_SimpleCubeRegression_Test::TestBody(Boolean_SimpleCubeRegression_Test *this)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  char *message;
  AssertHelper local_120;
  Message local_118;
  Error local_110;
  Error local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  vec<double,_3> local_f0;
  Manifold local_d8 [16];
  Manifold local_c8 [16];
  double local_b8;
  vec<double,_3> local_b0;
  Manifold local_98 [32];
  double local_78;
  vec<double,_3> local_70;
  Manifold local_58 [16];
  Manifold local_48 [16];
  Manifold local_38 [16];
  Manifold local_28 [8];
  Manifold result;
  bool selfIntersectionChecks;
  Boolean_SimpleCubeRegression_Test *this_local;
  
  lVar3 = manifold::ManifoldParams();
  bVar1 = *(byte *)(lVar3 + 1);
  lVar3 = manifold::ManifoldParams();
  *(undefined1 *)(lVar3 + 1) = 1;
  local_78 = 1.0;
  linalg::vec<double,_3>::vec(&local_70,&local_78);
  manifold::Manifold::Cube(local_58,0);
  manifold::Manifold::Rotate(-0.1,0.1,-1.0);
  local_b8 = 1.0;
  linalg::vec<double,_3>::vec(&local_b0,&local_b8);
  manifold::Manifold::Cube(local_98,0);
  manifold::Manifold::operator+(local_38,local_48);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3ff0000000000000;
  linalg::vec<double,_3>::vec(&local_f0,(double *)&gtest_ar.message_);
  manifold::Manifold::Cube(local_d8,0);
  manifold::Manifold::Rotate(-0.1,-0.10000000000066571,-1.0);
  manifold::Manifold::operator-(local_28,local_38);
  manifold::Manifold::~Manifold(local_c8);
  manifold::Manifold::~Manifold(local_d8);
  manifold::Manifold::~Manifold(local_38);
  manifold::Manifold::~Manifold(local_98);
  manifold::Manifold::~Manifold(local_48);
  manifold::Manifold::~Manifold(local_58);
  local_10c = manifold::Manifold::Status();
  local_110 = NoError;
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_108,"result.Status()","Manifold::Error::NoError",&local_10c,
             &local_110);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/boolean_test.cpp"
               ,0x1bf,message);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  lVar3 = manifold::ManifoldParams();
  *(byte *)(lVar3 + 1) = bVar1 & 1;
  manifold::Manifold::~Manifold(local_28);
  return;
}

Assistant:

TEST(Boolean, SimpleCubeRegression) {
  const bool selfIntersectionChecks = ManifoldParams().selfIntersectionChecks;
  ManifoldParams().selfIntersectionChecks = true;
  Manifold result =
      Manifold::Cube().Rotate(-0.10000000000000001, 0.10000000000000001, -1.) +
      Manifold::Cube() -
      Manifold::Cube().Rotate(-0.10000000000000001, -0.10000000000066571, -1.);
  EXPECT_EQ(result.Status(), Manifold::Error::NoError);
  ManifoldParams().selfIntersectionChecks = selfIntersectionChecks;
}